

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_CutAreaRefEdge_rec(Jf_Man_t *p,int *pCut)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint i;
  uint uVar4;
  
  uVar1 = (uint)(byte)*pCut;
  i = 1;
  uVar4 = (uint)(byte)*pCut;
  while( true ) {
    if ((uVar1 & 0xf) < i) {
      return uVar4;
    }
    uVar1 = Jf_CutVar(pCut,i);
    if (uVar1 == 0) break;
    piVar3 = p->pGia->pRefs;
    iVar2 = piVar3[uVar1];
    piVar3[uVar1] = iVar2 + 1;
    if (iVar2 == 0) {
      piVar3 = Jf_ObjCuts(p,uVar1);
      iVar2 = Jf_CutIsTriv(piVar3 + 1,uVar1);
      if (iVar2 == 0) {
        piVar3 = Jf_ObjCuts(p,uVar1);
        iVar2 = Jf_CutAreaRefEdge_rec(p,piVar3 + 1);
        uVar4 = uVar4 + iVar2;
      }
    }
    Vec_IntPush(p->vTemp,uVar1);
    i = i + 1;
    uVar1 = *pCut;
  }
  return uVar4;
}

Assistant:

int Jf_CutAreaRefEdge_rec( Jf_Man_t * p, int * pCut )
{
    int i, Var, Count = (Jf_CutCost(pCut) << 4) | Jf_CutSize(pCut);
    Jf_CutForEachVar( pCut, Var, i )
    {
        if ( !Gia_ObjRefIncId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var) )
            Count += Jf_CutAreaRefEdge_rec( p, Jf_ObjCutBest(p, Var) );
        Vec_IntPush( p->vTemp, Var );
    }
    return Count;
}